

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

bool cmSystemTools::IsInternallyOn(char *val)

{
  long *plVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  bool bVar5;
  string v;
  long *local_40;
  ulong local_38;
  long local_30 [2];
  
  if (val == (char *)0x0) {
    bVar5 = false;
  }
  else {
    local_40 = local_30;
    sVar3 = strlen(val);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,val,val + sVar3);
    plVar1 = local_40;
    if (local_38 < 5) {
      if (local_38 != 0) {
        uVar4 = 0;
        do {
          iVar2 = toupper((int)*(char *)((long)plVar1 + uVar4));
          *(char *)((long)plVar1 + uVar4) = (char)iVar2;
          uVar4 = uVar4 + 1;
        } while (local_38 != uVar4);
      }
      iVar2 = std::__cxx11::string::compare((char *)&local_40);
      bVar5 = iVar2 == 0;
    }
    else {
      bVar5 = false;
    }
    if (local_40 != local_30) {
      operator_delete(local_40,local_30[0] + 1);
    }
  }
  return bVar5;
}

Assistant:

bool cmSystemTools::IsInternallyOn(const char* val)
{
  if (!val) {
    return false;
  }
  std::string v = val;
  if (v.size() > 4) {
    return false;
  }

  for (char& c : v) {
    c = static_cast<char>(toupper(c));
  }
  return v == "I_ON";
}